

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mbedtls_wrapper.cpp
# Opt level: O1

void __thiscall duckdb_mbedtls::MbedTlsWrapper::SHA256State::FinishHex(SHA256State *this,char *out)

{
  byte bVar1;
  mbedtls_sha256_context *ctx;
  int iVar2;
  size_t i;
  long lVar3;
  runtime_error *this_00;
  string hash;
  uchar *local_38;
  undefined8 local_30;
  uchar local_28 [16];
  
  ctx = (mbedtls_sha256_context *)this->sha_context;
  local_30 = 0;
  local_28[0] = '\0';
  local_38 = local_28;
  std::__cxx11::string::resize((ulong)&local_38,' ');
  iVar2 = mbedtls_sha256_finish(ctx,local_38);
  if (iVar2 == 0) {
    lVar3 = 0;
    do {
      bVar1 = local_38[lVar3];
      out[lVar3 * 2] = "0123456789abcdef"[bVar1 >> 4];
      out[lVar3 * 2 + 1] = "0123456789abcdef"[bVar1 & 0xf];
      lVar3 = lVar3 + 1;
    } while (lVar3 != 0x20);
    if (local_38 != local_28) {
      operator_delete(local_38);
    }
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"SHA256 Error");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void MbedTlsWrapper::SHA256State::FinishHex(char *out) {
	auto context = reinterpret_cast<mbedtls_sha256_context *>(sha_context);

	string hash;
	hash.resize(MbedTlsWrapper::SHA256_HASH_LENGTH_BYTES);

	if (mbedtls_sha256_finish(context, (unsigned char *)hash.data())) {
		throw std::runtime_error("SHA256 Error");
	}

	MbedTlsWrapper::ToBase16(const_cast<char *>(hash.c_str()), out, MbedTlsWrapper::SHA256_HASH_LENGTH_BYTES);
}